

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O2

vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_> *
__thiscall
tt::net::Epoll::getEventsRequest
          (vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
           *__return_storage_ptr__,Epoll *this,int events_num)

{
  ulong uVar1;
  ulong uVar2;
  Logger local_1028;
  shared_ptr<tt::net::Channel> *local_50;
  undefined1 local_48 [8];
  SP_Channel cur_req;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = this->m_fd2chan;
  uVar2 = 0;
  uVar1 = (ulong)(uint)events_num;
  if (events_num < 1) {
    uVar1 = uVar2;
  }
  cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
  for (; uVar1 * 0xc - uVar2 != 0; uVar2 = uVar2 + 0xc) {
    std::__shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2> *)local_48,
               &local_50[*(int *)((long)&((this->m_events).
                                          super__Vector_base<epoll_event,_std::allocator<epoll_event>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->data + uVar2)]
                .super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>);
    if (local_48 == (undefined1  [8])0x0) {
      Logger::Logger(&local_1028,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/Epoll.cc"
                     ,0x8e);
      LogStream::operator<<((LogStream *)&local_1028,"SP cur_req is invaild");
      Logger::~Logger(&local_1028);
    }
    else {
      *(__uint32_t *)((long)local_48 + 0x10) =
           *(__uint32_t *)
            ((long)&((this->m_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                     _M_impl.super__Vector_impl_data._M_start)->events + uVar2);
      *(__uint32_t *)((long)local_48 + 0xc) = 0;
      std::
      vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
      ::push_back((vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
                   *)cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi,(value_type *)local_48);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cur_req);
  }
  return (vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
          *)cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
}

Assistant:

std::vector<SP_Channel> Epoll::getEventsRequest(int events_num){

	std::vector<SP_Channel> req_data;

	for( int i = 0 ; i < events_num ; ++ i ){

		//获取有事件产生的描述符
		int fd = m_events[i].data.fd;

		SP_Channel cur_req = m_fd2chan[fd];
		
		if(cur_req){
			
			cur_req->setRevents(m_events[i].events);
			cur_req->setEvents(0);

			//加入线程池之前将 Timer 和 request 分离
			
			//cur_req->seperateTimer();

			req_data.push_back(cur_req);
		}else{
			LOG << "SP cur_req is invaild";
		
		}
	}

	return req_data;
}